

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall
tf::Executor::_invoke_condition_task
          (Executor *this,Worker *worker,Node *node,SmallVector<int,_2U> *conds)

{
  initializer_list<int> IL;
  int iVar1;
  Node *in_RCX;
  Worker *in_RDX;
  Executor *in_RSI;
  function<int_()> *work;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  
  _observer_prologue(in_RSI,in_RDX,in_RCX);
  std::
  get_if<tf::Node::Condition,std::monostate,tf::Node::Static,tf::Node::Runtime,tf::Node::Subflow,tf::Node::Condition,tf::Node::MultiCondition,tf::Node::Module,tf::Node::Async,tf::Node::DependentAsync>
            ((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              *)0x119e71);
  iVar1 = std::function<int_()>::operator()
                    ((function<int_()> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  IL._M_len = 1;
  IL._M_array = (iterator)&stack0xffffffffffffffc4;
  SmallVector<int,_2U>::operator=
            ((SmallVector<int,_2U> *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),IL);
  _observer_epilogue(in_RSI,in_RDX,in_RCX);
  return;
}

Assistant:

inline void Executor::_invoke_condition_task(
  Worker& worker, Node* node, SmallVector<int>& conds
) {
  _observer_prologue(worker, node);
  TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
    auto& work = std::get_if<Node::Condition>(&node->_handle)->work;
    conds = { work() };
  });
  _observer_epilogue(worker, node);
}